

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

void __thiscall
glcts::ViewportArray::APIErrors::depthRangeIndexedHelper<float>
          (APIErrors *this,DepthFuncWrapper *depthFunc,GLint max_viewports,bool *test_result,
          float *param_4)

{
  (*depthFunc->m_gl->depthRangeIndexedfOES)(0,0.0,1.0);
  checkGLError(this,0,"depthRangeIndexed, <index> == 0",test_result);
  (*depthFunc->m_gl->depthRangeIndexedfOES)(max_viewports - 1,0.0,1.0);
  checkGLError(this,0,"depthRangeIndexed, <index> == GL_MAX_VIEWPORTS - 1",test_result);
  (*depthFunc->m_gl->depthRangeIndexedfOES)(max_viewports,0.0,1.0);
  checkGLError(this,0x501,"depthRangeIndexed, <index> == GL_MAX_VIEWPORTS",test_result);
  (*depthFunc->m_gl->depthRangeIndexedfOES)(max_viewports + 1,0.0,1.0);
  checkGLError(this,0x501,"depthRangeIndexed, <index> > GL_MAX_VIEWPORTS",test_result);
  return;
}

Assistant:

void APIErrors::depthRangeIndexedHelper(Utils::DepthFuncWrapper& depthFunc, GLint max_viewports, bool& test_result, T*)
{
	depthFunc.depthRangeIndexed(0 /* index */, (T)0.0, (T)1.0);
	checkGLError(GL_NO_ERROR, "depthRangeIndexed, <index> == 0", test_result);

	depthFunc.depthRangeIndexed(max_viewports - 1 /* index */, (T)0.0, (T)1.0);
	checkGLError(GL_NO_ERROR, "depthRangeIndexed, <index> == GL_MAX_VIEWPORTS - 1", test_result);

	depthFunc.depthRangeIndexed(max_viewports /* index */, (T)0.0, (T)1.0);
	checkGLError(GL_INVALID_VALUE, "depthRangeIndexed, <index> == GL_MAX_VIEWPORTS", test_result);

	depthFunc.depthRangeIndexed(max_viewports + 1 /* index */, (T)0.0, (T)1.0);
	checkGLError(GL_INVALID_VALUE, "depthRangeIndexed, <index> > GL_MAX_VIEWPORTS", test_result);
}